

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<unsigned_int,unsigned_char>(void)

{
  bool bVar1;
  uint7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffd0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd4;
  
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT44(in_stack_ffffffffffffffd4.m_int,in_stack_ffffffffffffffd0),
               (int *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar1 = ::operator!=((uchar)((uint)in_stack_ffffffffffffffd0 >> 0x18),in_stack_ffffffffffffffd4);
  uVar2 = false;
  if (bVar1) {
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4.m_int,in_stack_ffffffffffffffd0),
                 (int *)(ulong)in_stack_ffffffffffffffc8);
    bVar1 = ::operator!=(in_stack_ffffffffffffffd4,(uchar)((uint)in_stack_ffffffffffffffd0 >> 0x18))
    ;
    uVar2 = false;
    if (bVar1) {
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_ffffffffffffffd4.m_int,in_stack_ffffffffffffffd0),
                     (int *)(ulong)in_stack_ffffffffffffffc8);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_ffffffffffffffd4.m_int,in_stack_ffffffffffffffd0),
                     (int *)CONCAT17(uVar2,in_stack_ffffffffffffffc8));
      bVar1 = ::operator!=(in_stack_ffffffffffffffd4,
                           (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                            )(uchar)((uint)in_stack_ffffffffffffffd0 >> 0x18));
      uVar2 = false;
      if (bVar1) {
        SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
        ::SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_ffffffffffffffd4.m_int,in_stack_ffffffffffffffd0),
                       (int *)(ulong)in_stack_ffffffffffffffc8);
        bVar1 = ::operator!=(SUB41((uint)in_stack_ffffffffffffffd0 >> 0x18,0),
                             in_stack_ffffffffffffffd4);
        uVar2 = false;
        if (bVar1) {
          bVar1 = false;
          SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          ::SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)((ulong)in_stack_ffffffffffffffd4.m_int << 0x20),
                         (int *)(ulong)in_stack_ffffffffffffffc8);
          uVar2 = ::operator!=(bVar1,in_stack_ffffffffffffffd4);
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}